

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O0

ExprP<tcu::Vector<float,_2>_> __thiscall
vkt::shaderexecutor::Functions::Refract<2>::doExpand
          (Refract<2> *this,ExpandContext *ctx,ArgExprs *args)

{
  ExprP<tcu::Vector<float,_2>_> *in_RCX;
  SharedPtrStateBase *extraout_RDX;
  double __x;
  ExprP<tcu::Vector<float,_2>_> EVar1;
  ExprP<float> local_220;
  ExprP<float> local_210;
  ExprP<float> local_200;
  ExprP<tcu::Vector<float,_2>_> local_1f0;
  ExprP<tcu::Vector<float,_2>_> local_1e0;
  ExprP<tcu::Vector<float,_2>_> local_1d0;
  float local_1bc;
  ExprP<float> local_1b8;
  ExprP<tcu::Vector<float,_2>_> local_1a8;
  float local_194;
  ExprP<float> local_190;
  ExprP<bool> local_180;
  ExprP<float> local_170;
  float local_15c;
  ExprP<float> local_158;
  ExprP<float> local_148;
  ExprP<float> local_138;
  ExprP<float> local_128;
  float local_114;
  ExprP<float> local_110;
  ExprP<float> local_100;
  allocator<char> local_e9;
  string local_e8;
  VariableP<float> local_c8;
  undefined1 local_b8 [8];
  ExprP<float> k;
  allocator<char> local_81;
  string local_80;
  VariableP<float> local_60;
  undefined1 local_50 [8];
  ExprP<float> dotNI;
  ExprP<float> *eta;
  ExprP<tcu::Vector<float,_2>_> *n;
  ExprP<tcu::Vector<float,_2>_> *i;
  ArgExprs *args_local;
  ExpandContext *ctx_local;
  Refract<2> *this_local;
  
  dotNI.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.m_state =
       (SharedPtrStateBase *)(in_RCX + 2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"dotNI",&local_81);
  dot<2>((Functions *)
         &k.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.m_state,
         in_RCX + 1,in_RCX);
  bindExpression<float>
            ((shaderexecutor *)&local_60,&local_80,(ExpandContext *)args,
             (ExprP<float> *)
             &k.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.
              m_state);
  shaderexecutor::VariableP::operator_cast_to_ExprP((VariableP *)local_50);
  VariableP<float>::~VariableP(&local_60);
  ExprP<float>::~ExprP
            ((ExprP<float> *)
             &k.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.
              m_state);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"k",&local_e9);
  local_114 = 1.0;
  constant<float>((shaderexecutor *)&local_110,&local_114);
  shaderexecutor::operator*
            ((shaderexecutor *)&local_138,
             (ExprP<float> *)
             dotNI.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.
             m_state,(ExprP<float> *)
                     dotNI.super_ExprPBase<float>.
                     super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.m_state);
  local_15c = 1.0;
  constant<float>((shaderexecutor *)&local_158,&local_15c);
  shaderexecutor::operator*
            ((shaderexecutor *)&local_170,(ExprP<float> *)local_50,(ExprP<float> *)local_50);
  shaderexecutor::operator-((shaderexecutor *)&local_148,&local_158,&local_170);
  shaderexecutor::operator*((shaderexecutor *)&local_128,&local_138,&local_148);
  shaderexecutor::operator-((shaderexecutor *)&local_100,&local_110,&local_128);
  bindExpression<float>((shaderexecutor *)&local_c8,&local_e8,(ExpandContext *)args,&local_100);
  shaderexecutor::VariableP::operator_cast_to_ExprP((VariableP *)local_b8);
  VariableP<float>::~VariableP(&local_c8);
  ExprP<float>::~ExprP(&local_100);
  ExprP<float>::~ExprP(&local_128);
  ExprP<float>::~ExprP(&local_148);
  ExprP<float>::~ExprP(&local_170);
  ExprP<float>::~ExprP(&local_158);
  ExprP<float>::~ExprP(&local_138);
  ExprP<float>::~ExprP(&local_110);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator(&local_e9);
  local_194 = 0.0;
  constant<float>((shaderexecutor *)&local_190,&local_194);
  shaderexecutor::operator<((shaderexecutor *)&local_180,(ExprP<float> *)local_b8,&local_190);
  local_1bc = 0.0;
  constant<float>((shaderexecutor *)&local_1b8,&local_1bc);
  genXType<float,2>((Functions *)&local_1a8,&local_1b8);
  shaderexecutor::operator*
            ((shaderexecutor *)&local_1e0,in_RCX,
             (ExprP<float> *)
             dotNI.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.
             m_state);
  shaderexecutor::operator*
            ((shaderexecutor *)&local_210,
             (ExprP<float> *)
             dotNI.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.
             m_state,(ExprP<float> *)local_50);
  sqrt((Functions *)&local_220,__x);
  shaderexecutor::operator+((shaderexecutor *)&local_200,&local_210,&local_220);
  shaderexecutor::operator*((shaderexecutor *)&local_1f0,in_RCX + 1,&local_200);
  shaderexecutor::operator-((shaderexecutor *)&local_1d0,&local_1e0,&local_1f0);
  cond<tcu::Vector<float,2>>((shaderexecutor *)this,&local_180,&local_1a8,&local_1d0);
  ExprP<tcu::Vector<float,_2>_>::~ExprP(&local_1d0);
  ExprP<tcu::Vector<float,_2>_>::~ExprP(&local_1f0);
  ExprP<float>::~ExprP(&local_200);
  ExprP<float>::~ExprP(&local_220);
  ExprP<float>::~ExprP(&local_210);
  ExprP<tcu::Vector<float,_2>_>::~ExprP(&local_1e0);
  ExprP<tcu::Vector<float,_2>_>::~ExprP(&local_1a8);
  ExprP<float>::~ExprP(&local_1b8);
  ExprP<bool>::~ExprP(&local_180);
  ExprP<float>::~ExprP(&local_190);
  ExprP<float>::~ExprP((ExprP<float> *)local_b8);
  ExprP<float>::~ExprP((ExprP<float> *)local_50);
  EVar1.super_ContainerExprPBase<tcu::Vector<float,_2>_>.super_ExprPBase<tcu::Vector<float,_2>_>.
  super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Vector<float,_2>_>_>.m_state = extraout_RDX;
  EVar1.super_ContainerExprPBase<tcu::Vector<float,_2>_>.super_ExprPBase<tcu::Vector<float,_2>_>.
  super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Vector<float,_2>_>_>.m_ptr =
       (Expr<tcu::Vector<float,_2>_> *)this;
  return (ExprP<tcu::Vector<float,_2>_>)
         EVar1.super_ContainerExprPBase<tcu::Vector<float,_2>_>.
         super_ExprPBase<tcu::Vector<float,_2>_>.
         super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Vector<float,_2>_>_>;
}

Assistant:

ExprP<Ret>	doExpand	(ExpandContext&	ctx, const ArgExprs& args) const
	{
		const ExprP<Arg0>&	i		= args.a;
		const ExprP<Arg1>&	n		= args.b;
		const ExprP<float>&	eta		= args.c;
		const ExprP<float>	dotNI	= bindExpression("dotNI", ctx, dot(n, i));
		const ExprP<float>	k		= bindExpression("k", ctx, constant(1.0f) - eta * eta *
												 (constant(1.0f) - dotNI * dotNI));

		return cond(k < constant(0.0f),
					genXType<float, Size>(constant(0.0f)),
					i * eta - n * (eta * dotNI + sqrt(k)));
	}